

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatCommon.h
# Opt level: O1

void __thiscall llvm::FmtAlign::format(FmtAlign *this,raw_ostream *S,StringRef Options)

{
  uint *puVar1;
  size_t __n;
  void *__buf;
  uint32_t Count;
  uint32_t Count_00;
  ulong uVar2;
  undefined1 local_b0 [8];
  raw_svector_ostream Stream;
  SmallString<64U> Item;
  
  __n = Options.Length;
  if (this->Amount != 0) {
    puVar1 = &Item.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size;
    Item.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = (void *)0x4000000000;
    Stream.OS = (SmallVectorImpl<char> *)puVar1;
    raw_svector_ostream::raw_svector_ostream
              ((raw_svector_ostream *)local_b0,(SmallVectorImpl<char> *)&Stream.OS);
    (*this->Adapter->_vptr_format_adapter[3])(this->Adapter,local_b0,Options.Data);
    __buf = (void *)((ulong)Item.super_SmallVector<char,_64U>.super_SmallVectorImpl<char>.
                            super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                    & 0xffffffff);
    uVar2 = (long)this->Amount - (long)__buf;
    if ((void *)this->Amount < __buf || uVar2 == 0) {
      raw_ostream::write(S,(int)Stream.OS,__buf,__n);
    }
    else {
      Count_00 = (uint32_t)uVar2;
      if (this->Where == Left) {
        raw_ostream::write(S,(int)Stream.OS,__buf,__n);
        fill(this,S,Count_00);
      }
      else if (this->Where == Center) {
        Count = (uint32_t)(uVar2 >> 1);
        fill(this,S,Count);
        raw_ostream::write(S,(int)Stream.OS,
                           (void *)((ulong)Item.super_SmallVector<char,_64U>.
                                           super_SmallVectorImpl<char>.
                                           super_SmallVectorTemplateBase<char,_true>.
                                           super_SmallVectorTemplateCommon<char,_void>.
                                           super_SmallVectorBase.BeginX & 0xffffffff),__n);
        fill(this,S,Count_00 - Count);
      }
      else {
        fill(this,S,Count_00);
        raw_ostream::write(S,(int)Stream.OS,
                           (void *)((ulong)Item.super_SmallVector<char,_64U>.
                                           super_SmallVectorImpl<char>.
                                           super_SmallVectorTemplateBase<char,_true>.
                                           super_SmallVectorTemplateCommon<char,_void>.
                                           super_SmallVectorBase.BeginX & 0xffffffff),__n);
      }
    }
    raw_ostream::~raw_ostream((raw_ostream *)local_b0);
    if (Stream.OS != (SmallVectorImpl<char> *)puVar1) {
      free(Stream.OS);
    }
    return;
  }
  (*this->Adapter->_vptr_format_adapter[3])(this->Adapter,S,Options.Data,__n);
  return;
}

Assistant:

void format(raw_ostream &S, StringRef Options) {
    // If we don't need to align, we can format straight into the underlying
    // stream.  Otherwise we have to go through an intermediate stream first
    // in order to calculate how long the output is so we can align it.
    // TODO: Make the format method return the number of bytes written, that
    // way we can also skip the intermediate stream for left-aligned output.
    if (Amount == 0) {
      Adapter.format(S, Options);
      return;
    }
    SmallString<64> Item;
    raw_svector_ostream Stream(Item);

    Adapter.format(Stream, Options);
    if (Amount <= Item.size()) {
      S << Item;
      return;
    }

    size_t PadAmount = Amount - Item.size();
    switch (Where) {
    case AlignStyle::Left:
      S << Item;
      fill(S, PadAmount);
      break;
    case AlignStyle::Center: {
      size_t X = PadAmount / 2;
      fill(S, X);
      S << Item;
      fill(S, PadAmount - X);
      break;
    }
    default:
      fill(S, PadAmount);
      S << Item;
      break;
    }
  }